

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

Data * __thiscall
QTzTimeZonePrivate::nextTransition
          (Data *__return_storage_ptr__,QTzTimeZonePrivate *this,qint64 afterMSecsSinceEpoch)

{
  QTzTransitionRule *pQVar1;
  undefined4 uVar2;
  Data *pDVar3;
  QTzTransitionRule *pQVar4;
  undefined4 uVar5;
  undefined1 *puVar6;
  int iVar7;
  int iVar8;
  Data *pDVar9;
  QTzTransitionTime *pQVar10;
  QTzTransitionTime *pQVar11;
  undefined1 *puVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  QTzTransitionRule rule;
  QArrayDataPointer<QTimeZonePrivate::Data> local_48;
  long local_28;
  ulong uVar14;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->cached_data).m_posixRule.d.size == 0) {
    pQVar10 = (this->cached_data).m_tranTimes.d.ptr;
    uVar13 = (this->cached_data).m_tranTimes.d.size;
    pQVar11 = pQVar10 + uVar13;
    goto joined_r0x003fe99e;
  }
  uVar14 = (this->cached_data).m_tranTimes.d.size;
  if ((uVar14 == 0) ||
     (pQVar10 = (this->cached_data).m_tranTimes.d.ptr,
     pQVar10[uVar14 - 1].atMSecsSinceEpoch < afterMSecsSinceEpoch)) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    getPosixTransitions((QList<QTimeZonePrivate::Data> *)&local_48,this,afterMSecsSinceEpoch);
    pDVar9 = local_48.ptr;
    puVar12 = (undefined1 *)local_48.size;
    while (puVar6 = puVar12, 0 < (long)puVar6) {
      puVar12 = (undefined1 *)((ulong)puVar6 >> 1);
      if (pDVar9[(long)puVar12].atMSecsSinceEpoch <= afterMSecsSinceEpoch) {
        pDVar9 = pDVar9 + (long)(puVar12 + 1);
        puVar12 = puVar6 + ~(ulong)puVar12;
      }
    }
    if (pDVar9 == local_48.ptr + local_48.size) {
      (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
      (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->abbreviation).d.size = 0;
      __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
      __return_storage_ptr__->offsetFromUtc = -0x80000000;
      __return_storage_ptr__->standardTimeOffset = -0x80000000;
      __return_storage_ptr__->daylightTimeOffset = -0x80000000;
    }
    else {
      pDVar3 = (pDVar9->abbreviation).d.d;
      (__return_storage_ptr__->abbreviation).d.d = pDVar3;
      (__return_storage_ptr__->abbreviation).d.ptr = (pDVar9->abbreviation).d.ptr;
      (__return_storage_ptr__->abbreviation).d.size = (pDVar9->abbreviation).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      __return_storage_ptr__->daylightTimeOffset = pDVar9->daylightTimeOffset;
      iVar7 = pDVar9->offsetFromUtc;
      iVar8 = pDVar9->standardTimeOffset;
      __return_storage_ptr__->atMSecsSinceEpoch = pDVar9->atMSecsSinceEpoch;
      __return_storage_ptr__->offsetFromUtc = iVar7;
      __return_storage_ptr__->standardTimeOffset = iVar8;
    }
    QArrayDataPointer<QTimeZonePrivate::Data>::~QArrayDataPointer(&local_48);
  }
  else {
    pQVar11 = pQVar10 + uVar14;
    do {
      uVar13 = uVar14 >> 1;
      if (pQVar10[uVar13].atMSecsSinceEpoch <= afterMSecsSinceEpoch) {
        pQVar10 = pQVar10 + uVar13 + 1;
        uVar13 = ~uVar13 + uVar14;
      }
joined_r0x003fe99e:
      uVar14 = uVar13;
    } while (0 < (long)uVar14);
    if (pQVar10 != pQVar11) {
      pQVar4 = (this->cached_data).m_tranRules.d.ptr;
      pQVar1 = pQVar4 + pQVar10->ruleIndex;
      uVar2 = pQVar1->stdOffset;
      uVar5 = pQVar1->dstOffset;
      rule.dstOffset = uVar5;
      rule.stdOffset = uVar2;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        rule.abbreviationIndex = pQVar4[pQVar10->ruleIndex].abbreviationIndex;
        rule._9_3_ = 0;
        dataFromRule(__return_storage_ptr__,this,rule,pQVar10->atMSecsSinceEpoch);
        return __return_storage_ptr__;
      }
      goto LAB_003fea81;
    }
    (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
    (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->abbreviation).d.size = 0;
    __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
    __return_storage_ptr__->offsetFromUtc = -0x80000000;
    __return_storage_ptr__->standardTimeOffset = -0x80000000;
    __return_storage_ptr__->daylightTimeOffset = -0x80000000;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_003fea81:
  __stack_chk_fail();
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::nextTransition(qint64 afterMSecsSinceEpoch) const
{
    // If the required time is after the last transition (or there were none)
    // and we have a POSIX rule, then use it:
    if (!cached_data.m_posixRule.isEmpty()
        && (tranCache().isEmpty() || tranCache().last().atMSecsSinceEpoch < afterMSecsSinceEpoch)) {
        QList<Data> posixTrans = getPosixTransitions(afterMSecsSinceEpoch);
        auto it = std::partition_point(posixTrans.cbegin(), posixTrans.cend(),
                                       [afterMSecsSinceEpoch] (const Data &at) {
                                           return at.atMSecsSinceEpoch <= afterMSecsSinceEpoch;
                                       });

        return it == posixTrans.cend() ? Data{} : *it;
    }

    // Otherwise, if we can find a valid tran, use its rule:
    auto last = std::partition_point(tranCache().cbegin(), tranCache().cend(),
                                     [afterMSecsSinceEpoch] (QTzTransitionTime at) {
                                         return at.atMSecsSinceEpoch <= afterMSecsSinceEpoch;
                                     });
    return last != tranCache().cend() ? dataForTzTransition(*last) : Data{};
}